

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testcrypt.c
# Opt level: O2

strbuf * des3_encrypt_pubkey_ossh_wrapper(ptrlen key,ptrlen iv,ptrlen data)

{
  strbuf *psVar1;
  char *p;
  
  if (key.len == 0x18) {
    if (iv.len == 8) {
      if (((undefined1  [16])data & (undefined1  [16])0x7) == (undefined1  [16])0x0) {
        psVar1 = strbuf_dup(data);
        des3_encrypt_pubkey_ossh(key.ptr,iv.ptr,psVar1->u,(int)psVar1->len);
        return psVar1;
      }
      p = "des3_encrypt_pubkey_ossh: data must be a multiple of 8 bytes";
    }
    else {
      p = "des3_encrypt_pubkey_ossh: iv must be 8 bytes long";
    }
  }
  else {
    p = "des3_encrypt_pubkey_ossh: key must be 24 bytes long";
  }
  fatal_error(p);
}

Assistant:

strbuf *des3_encrypt_pubkey_ossh_wrapper(ptrlen key, ptrlen iv, ptrlen data)
{
    if (key.len != 24)
        fatal_error("des3_encrypt_pubkey_ossh: key must be 24 bytes long");
    if (iv.len != 8)
        fatal_error("des3_encrypt_pubkey_ossh: iv must be 8 bytes long");
    if (data.len % 8 != 0)
        fatal_error("des3_encrypt_pubkey_ossh: data must be a multiple of 8 bytes");
    strbuf *sb = strbuf_dup(data);
    des3_encrypt_pubkey_ossh(key.ptr, iv.ptr, sb->u, sb->len);
    return sb;
}